

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O0

void ncnn::innerproduct_fp16s_pack4_sse_f16c
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  Option *in_R9;
  Mat *in_stack_000003a0;
  int in_stack_000003ac;
  Mat *in_stack_000003b0;
  Mat *in_stack_000003b8;
  Mat *in_stack_000003c0;
  Mat *in_stack_000003c8;
  
  innerproduct_fp16s_pack4_sse
            (in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,
             in_stack_000003ac,in_stack_000003a0,in_R9);
  return;
}

Assistant:

void innerproduct_fp16s_pack4_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    innerproduct_fp16s_pack4_sse(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
}